

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

type __thiscall
fmt::v5::internal::printf_width_handler<wchar_t>::operator()
          (printf_width_handler<wchar_t> *this,uint value)

{
  type_conflict4 tVar1;
  uint uVar2;
  char *message;
  uint in_ESI;
  format_error *in_RDI;
  uint int_max;
  UnsignedType width;
  uint local_10;
  
  tVar1 = is_negative<unsigned_int>(in_ESI);
  local_10 = in_ESI;
  if (tVar1) {
    *(undefined4 *)(*(long *)in_RDI + 8) = 1;
    local_10 = -in_ESI;
  }
  uVar2 = std::numeric_limits<int>::max();
  if (local_10 <= uVar2) {
    return local_10;
  }
  message = (char *)__cxa_allocate_exception(0x10);
  format_error::format_error(in_RDI,message);
  __cxa_throw(message,&format_error::typeinfo,format_error::~format_error);
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, unsigned>::type
      operator()(T value) {
    typedef typename internal::int_traits<T>::main_type UnsignedType;
    UnsignedType width = static_cast<UnsignedType>(value);
    if (internal::is_negative(value)) {
      spec_.align_ = ALIGN_LEFT;
      width = 0 - width;
    }
    unsigned int_max = std::numeric_limits<int>::max();
    if (width > int_max)
      FMT_THROW(format_error("number is too big"));
    return static_cast<unsigned>(width);
  }